

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O3

int bcf_sr_add_reader(bcf_srs_t *files,char *fname)

{
  bcf_sr_error *pbVar1;
  bcf_sr_t *pbVar2;
  htsExactFormat hVar3;
  char *pcVar4;
  bcf_sr_t *pbVar5;
  int iVar6;
  htsFile *hfp;
  int *piVar7;
  bcf_sr_t *pbVar8;
  tbx_t *ptVar9;
  bcf_hdr_t *pbVar10;
  hts_idx_t *phVar11;
  char *pcVar12;
  char **__ptr;
  bcf_sr_regions_t *pbVar13;
  ulong uVar14;
  char *id;
  char *__src;
  long lVar15;
  ulong __size;
  int iVar16;
  size_t __n;
  long lVar17;
  int n;
  int local_74;
  char *local_70;
  bcf_sr_t *local_68;
  char *local_60;
  bcf_srs_t *local_58;
  char *local_50;
  bcf_hdr_t *local_48;
  int *local_40;
  long local_38;
  
  hfp = hts_open(fname,"r");
  if (hfp == (htsFile *)0x0) {
    files->errnum = open_failed;
    return 0;
  }
  piVar7 = (int *)realloc(files->has_line,(long)files->nreaders * 4 + 4);
  files->has_line = piVar7;
  iVar16 = files->nreaders;
  piVar7[iVar16] = 0;
  pbVar8 = (bcf_sr_t *)realloc(files->readers,(long)iVar16 * 0x60 + 0x60);
  files->readers = pbVar8;
  iVar16 = files->nreaders;
  files->nreaders = iVar16 + 1;
  pbVar2 = pbVar8 + iVar16;
  pbVar8[iVar16].tbx_idx = (tbx_t *)0x0;
  (&pbVar8[iVar16].tbx_idx)[1] = (tbx_t *)0x0;
  pbVar8[iVar16].header = (bcf_hdr_t *)0x0;
  (&pbVar8[iVar16].header)[1] = (bcf_hdr_t *)0x0;
  pbVar8[iVar16].fname = (char *)0x0;
  (&pbVar8[iVar16].fname)[1] = (char *)0x0;
  pbVar5 = pbVar8 + iVar16;
  pbVar5->nbuffer = 0;
  pbVar5->mbuffer = 0;
  *(undefined8 *)(&pbVar5->nbuffer + 2) = 0;
  pbVar8[iVar16].filter_ids = (int *)0x0;
  (&pbVar8[iVar16].filter_ids)[1] = (int *)0x0;
  *(undefined8 *)&pbVar8[iVar16].n_smpl = 0;
  pbVar8[iVar16].file = hfp;
  pbVar1 = &files->errnum;
  files->errnum = open_failed;
  hVar3 = (hfp->format).format;
  if (files->require_index == 0) {
    if ((hVar3 & ~binary_format) != vcf) {
LAB_00113d0e:
      *pbVar1 = file_type_error;
      return 0;
    }
    pbVar10 = bcf_hdr_read(hfp);
    pbVar2->header = pbVar10;
    files->streaming = 1;
  }
  else if (hVar3 == bcf) {
    if ((hfp->format).compression != bgzf) {
LAB_00113ee5:
      *pbVar1 = not_bgzf;
      return 0;
    }
    pbVar10 = bcf_hdr_read(hfp);
    pbVar2->header = pbVar10;
    phVar11 = hts_idx_load(fname,0);
    pbVar2->bcf_idx = phVar11;
    if (phVar11 == (hts_idx_t *)0x0) {
      *pbVar1 = idx_load_failed;
      return 0;
    }
  }
  else {
    if (hVar3 != vcf) goto LAB_00113d0e;
    if ((hfp->format).compression != bgzf) goto LAB_00113ee5;
    ptVar9 = tbx_index_load(fname);
    pbVar2->tbx_idx = ptVar9;
    if (ptVar9 == (tbx_t *)0x0) {
      *pbVar1 = idx_load_failed;
      return 0;
    }
    pbVar10 = bcf_hdr_read(pbVar2->file);
    pbVar2->header = pbVar10;
  }
  if (files->streaming != 0) {
    if (1 < files->nreaders) {
      *pbVar1 = api_usage_error;
      fprintf(_stderr,"[%s:%d %s] Error: %d readers, yet require_index not set\n",
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
              ,0xd0,"bcf_sr_add_reader");
      return 0;
    }
    if (files->regions != (bcf_sr_regions_t *)0x0) {
      bcf_sr_add_reader_cold_1();
      return 0;
    }
  }
  local_48 = pbVar2->header;
  if (local_48 == (bcf_hdr_t *)0x0) {
    *pbVar1 = header_error;
    return 0;
  }
  pbVar2->fname = fname;
  __src = files->apply_filters;
  local_68 = pbVar2;
  if (__src != (char *)0x0) {
    lVar15 = (long)__src << 0x20;
    local_60 = __src + -1;
    __size = 0;
    local_70 = (char *)0x0;
    iVar16 = 0;
    piVar7 = (int *)0x0;
    pcVar4 = __src;
    local_58 = files;
    do {
      if ((*pcVar4 == ',') || (*pcVar4 == '\0')) {
        lVar17 = (long)iVar16;
        piVar7 = (int *)realloc(piVar7,lVar17 * 4 + 4);
        id = local_70;
        if ((__src != local_60) || (iVar6 = -1, *__src != '.')) {
          __n = lVar15 - ((long)__src << 0x20) >> 0x20;
          uVar14 = __n + 1;
          pcVar12 = local_70;
          local_40 = piVar7;
          local_38 = lVar15;
          if (uVar14 < __size) {
LAB_00113e86:
            id = pcVar12;
            memcpy(id,__src,__n);
            id[__n] = '\0';
          }
          else {
            uVar14 = uVar14 >> 1 | uVar14;
            uVar14 = uVar14 >> 2 | uVar14;
            uVar14 = uVar14 >> 4 | uVar14;
            uVar14 = uVar14 >> 8 | uVar14;
            __size = (uVar14 >> 0x10 | uVar14) + 1;
            local_50 = __src;
            pcVar12 = (char *)realloc(local_70,__size);
            __src = local_50;
            if (pcVar12 != (char *)0x0) goto LAB_00113e86;
          }
          local_70 = id;
          iVar6 = bcf_hdr_id2int(local_48,0,id);
          piVar7 = local_40;
          lVar15 = local_38;
        }
        iVar16 = iVar16 + 1;
        piVar7[lVar17] = iVar6;
        __src = pcVar4 + 1;
        if (*pcVar4 == '\0') goto LAB_00113ef2;
      }
      lVar15 = lVar15 + 0x100000000;
      local_60 = local_60 + 1;
      pcVar4 = pcVar4 + 1;
    } while( true );
  }
LAB_00113f19:
  if ((files->explicit_regs == 0) && (files->streaming == 0)) {
    if (local_68->tbx_idx == (tbx_t *)0x0) {
      __ptr = bcf_hdr_seqnames(local_68->header,&local_74);
    }
    else {
      __ptr = tbx_seqnames(local_68->tbx_idx,&local_74);
    }
    if (0 < local_74) {
      lVar15 = 0;
      do {
        if (files->regions == (bcf_sr_regions_t *)0x0) {
          pbVar13 = _regions_init_string(__ptr[lVar15]);
          files->regions = pbVar13;
        }
        else {
          _regions_add(files->regions,__ptr[lVar15],-1,-1);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < local_74);
    }
    free(__ptr);
  }
  return 1;
LAB_00113ef2:
  if (__size != 0) {
    free(local_70);
  }
  local_68->nfilter_ids = iVar16;
  local_68->filter_ids = piVar7;
  files = local_58;
  goto LAB_00113f19;
}

Assistant:

int bcf_sr_add_reader(bcf_srs_t *files, const char *fname)
{
    htsFile* file_ptr = hts_open(fname, "r");
    if ( ! file_ptr ) {
        files->errnum = open_failed;
        return 0;
    }

    files->has_line = (int*) realloc(files->has_line, sizeof(int)*(files->nreaders+1));
    files->has_line[files->nreaders] = 0;
    files->readers  = (bcf_sr_t*) realloc(files->readers, sizeof(bcf_sr_t)*(files->nreaders+1));
    bcf_sr_t *reader = &files->readers[files->nreaders++];
    memset(reader,0,sizeof(bcf_sr_t));

    reader->file = file_ptr;

    files->errnum = 0;

    if ( files->require_index )
    {
        if ( reader->file->format.format==vcf )
        {
            if ( reader->file->format.compression!=bgzf )
            {
                files->errnum = not_bgzf;
                return 0;
            }

            reader->tbx_idx = tbx_index_load(fname);
            if ( !reader->tbx_idx )
            {
                files->errnum = idx_load_failed;
                return 0;
            }

            reader->header = bcf_hdr_read(reader->file);
        }
        else if ( reader->file->format.format==bcf )
        {
            if ( reader->file->format.compression!=bgzf )
            {
                files->errnum = not_bgzf;
                return 0;
            }

            reader->header = bcf_hdr_read(reader->file);

            reader->bcf_idx = bcf_index_load(fname);
            if ( !reader->bcf_idx )
            {
                files->errnum = idx_load_failed;
                return 0;
            }
        }
        else
        {
            files->errnum = file_type_error;
            return 0;
        }
    }
    else
    {
        if ( reader->file->format.format==bcf || reader->file->format.format==vcf )
        {
            reader->header = bcf_hdr_read(reader->file);
        }
        else
        {
            files->errnum = file_type_error;
            return 0;
        }
        files->streaming = 1;
    }
    if ( files->streaming && files->nreaders>1 )
    {
        files->errnum = api_usage_error;
        fprintf(stderr,"[%s:%d %s] Error: %d readers, yet require_index not set\n", __FILE__,__LINE__,__FUNCTION__,files->nreaders);
        return 0;
    }
    if ( files->streaming && files->regions )
    {
        files->errnum = api_usage_error;
        fprintf(stderr,"[%s:%d %s] Error: cannot tabix-jump in streaming mode\n", __FILE__,__LINE__,__FUNCTION__);
        return 0;
    }
    if ( !reader->header )
    {
        files->errnum = header_error;
        return 0;
    }

    reader->fname = fname;
    if ( files->apply_filters )
        reader->filter_ids = init_filters(reader->header, files->apply_filters, &reader->nfilter_ids);

    // Update list of chromosomes
    if ( !files->explicit_regs && !files->streaming )
    {
        int n,i;
        const char **names = reader->tbx_idx ? tbx_seqnames(reader->tbx_idx, &n) : bcf_hdr_seqnames(reader->header, &n);
        for (i=0; i<n; i++)
        {
            if ( !files->regions )
                files->regions = _regions_init_string(names[i]);
            else
                _regions_add(files->regions, names[i], -1, -1);
        }
        free(names);
    }

    return 1;
}